

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  value_type vVar4;
  uint uVar5;
  value_type *pvVar6;
  size_t sVar7;
  value_type vVar8;
  value_type *pvVar9;
  byte bVar10;
  uint uVar11;
  long lVar12;
  value_type avStack_15 [13];
  
  uVar5 = *(uint *)this;
  iVar1 = *(int *)(this + 4);
  pvVar9 = avStack_15 + iVar1;
  uVar11 = uVar5;
  if (99 < uVar5) {
    do {
      uVar11 = uVar5 / 100;
      *(undefined2 *)(pvVar9 + -2) =
           *(undefined2 *)(internal::basic_data<void>::DIGITS + (ulong)(uVar5 % 100) * 2);
      pvVar9 = pvVar9 + -2;
      bVar3 = 9999 < uVar5;
      uVar5 = uVar5 / 100;
    } while (bVar3);
  }
  pvVar6 = (it->super_truncating_iterator_base<char_*>).out_;
  uVar2 = (it->super_truncating_iterator_base<char_*>).limit_;
  sVar7 = (it->super_truncating_iterator_base<char_*>).count_;
  vVar8 = it->blackhole_;
  if (uVar11 < 10) {
    bVar10 = (byte)uVar11 | 0x30;
    lVar12 = -1;
  }
  else {
    pvVar9[-1] = internal::basic_data<void>::DIGITS[((ulong)uVar11 * 2 & 0xffffffff) + 1];
    bVar10 = internal::basic_data<void>::DIGITS[(ulong)uVar11 * 2];
    lVar12 = -2;
  }
  pvVar9[lVar12] = bVar10;
  if (0 < iVar1) {
    lVar12 = 0;
    do {
      vVar4 = avStack_15[lVar12];
      if (sVar7 + lVar12 < uVar2) {
        *pvVar6 = avStack_15[lVar12];
        vVar4 = vVar8;
      }
      vVar8 = vVar4;
      pvVar6 = pvVar6 + (sVar7 + lVar12 < uVar2);
      lVar12 = lVar12 + 1;
    } while (iVar1 != lVar12);
    sVar7 = sVar7 + lVar12;
  }
  (it->super_truncating_iterator_base<char_*>).out_ = pvVar6;
  (it->super_truncating_iterator_base<char_*>).limit_ = uVar2;
  (it->super_truncating_iterator_base<char_*>).count_ = sVar7;
  it->blackhole_ = vVar8;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }